

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

IntersecRes * intersectionT(IntersecRes *__return_storage_ptr__,Segment *segment,Triangle *triangle)

{
  Point p;
  bool bVar1;
  float fVar2;
  Point PVar3;
  Vector VVar4;
  undefined8 local_1f8;
  float local_1f0;
  Point local_1d8 [4];
  Point local_1a8;
  undefined8 local_198;
  float local_190;
  Point res;
  float t;
  float v;
  float local_170;
  undefined1 local_168 [8];
  Vector Q;
  float u;
  float local_150;
  undefined1 local_12c [8];
  Vector T;
  float inv_det;
  float det;
  float local_110;
  undefined1 local_104 [8];
  Vector P;
  float local_f0;
  undefined1 local_c8 [8];
  Vector e2;
  float fStack_b4;
  float local_b0;
  undefined1 local_88 [8];
  Vector e1;
  float fStack_74;
  float local_70;
  Vector local_68 [4];
  Vector local_38;
  undefined1 local_28 [8];
  Vector D;
  Triangle *triangle_local;
  Segment *segment_local;
  
  unique0x100003a5 = triangle;
  PVar3 = operator-(segment->b,&segment->a);
  local_68[0].z = PVar3.z;
  local_38.z = local_68[0].z;
  local_68[0]._0_8_ = PVar3._0_8_;
  local_38.x = local_68[0].x;
  local_38.y = local_68[0].y;
  VVar4 = normalize(&local_38);
  local_70 = VVar4.z;
  D.x = local_70;
  stack0xffffffffffffff88 = VVar4._0_8_;
  local_28._0_4_ = e1.z;
  local_28._4_4_ = fStack_74;
  unique0x10000399 = VVar4;
  PVar3 = operator-(stack0xffffffffffffffe8->y,&stack0xffffffffffffffe8->x);
  local_b0 = PVar3.z;
  e1.x = local_b0;
  stack0xffffffffffffff48 = PVar3._0_8_;
  local_88._0_4_ = e2.z;
  local_88._4_4_ = fStack_b4;
  unique0x1000038d = PVar3;
  PVar3 = operator-(stack0xffffffffffffffe8->z,&stack0xffffffffffffffe8->x);
  local_f0 = PVar3.z;
  e2.x = local_f0;
  P._4_8_ = PVar3._0_8_;
  local_c8._0_4_ = P.y;
  local_c8._4_4_ = P.z;
  unique0x10000381 = PVar3;
  VVar4 = crossProduct((Vector *)local_28,(Vector *)local_c8);
  _inv_det = VVar4._0_8_;
  local_104._0_4_ = inv_det;
  local_104._4_4_ = det;
  local_110 = VVar4.z;
  P.x = local_110;
  T.z = dotProduct((Vector *)local_88,(Vector *)local_104);
  bVar1 = isCloseToZero<float>(T.z);
  if (bVar1) {
    memset(__return_storage_ptr__,0,0x14);
    __return_storage_ptr__->exists = false;
  }
  else {
    T.y = 1.0 / T.z;
    PVar3 = operator-(segment->a,&stack0xffffffffffffffe8->x);
    stack0xfffffffffffffea8 = PVar3._0_8_;
    local_12c._0_4_ = Q.z;
    local_12c._4_4_ = u;
    local_150 = PVar3.z;
    T.x = local_150;
    unique0x10000375 = PVar3;
    fVar2 = dotProduct((Vector *)local_12c,(Vector *)local_104);
    Q.y = fVar2 * T.y;
    if ((Q.y < 0.0) || (1.0 < Q.y)) {
      memset(__return_storage_ptr__,0,0x14);
      __return_storage_ptr__->exists = false;
    }
    else {
      VVar4 = crossProduct((Vector *)local_12c,(Vector *)local_88);
      _t = VVar4._0_8_;
      local_168._0_4_ = t;
      local_168._4_4_ = v;
      local_170 = VVar4.z;
      Q.x = local_170;
      fVar2 = dotProduct((Vector *)local_28,(Vector *)local_168);
      res.z = fVar2 * T.y;
      if ((res.z < 0.0) || (1.0 < Q.y + res.z)) {
        memset(__return_storage_ptr__,0,0x14);
        __return_storage_ptr__->exists = false;
      }
      else {
        fVar2 = dotProduct((Vector *)local_c8,(Vector *)local_168);
        res.y = fVar2 * T.y;
        if (res.y <= 0.0) {
          memset(__return_storage_ptr__,0,0x14);
          __return_storage_ptr__->exists = false;
        }
        else {
          local_190 = (segment->a).z;
          local_198._0_4_ = (segment->a).x;
          local_198._4_4_ = (segment->a).y;
          p.z = D.x;
          p.x = (float)local_28._0_4_;
          p.y = (float)local_28._4_4_;
          PVar3 = operator*(p,res.y);
          local_1d8[0].z = PVar3.z;
          local_1a8.z = local_1d8[0].z;
          local_1d8[0]._0_8_ = PVar3._0_8_;
          local_1a8.x = local_1d8[0].x;
          local_1a8.y = local_1d8[0].y;
          PVar3.z = local_190;
          PVar3.x = (float)(undefined4)local_198;
          PVar3.y = (float)local_198._4_4_;
          PVar3 = operator+(PVar3,&local_1a8);
          local_1f8 = PVar3._0_8_;
          local_1f0 = PVar3.z;
          __return_storage_ptr__->exists = true;
          (__return_storage_ptr__->point).x = (float)(undefined4)local_1f8;
          (__return_storage_ptr__->point).y = (float)local_1f8._4_4_;
          (__return_storage_ptr__->point).z = local_1f0;
          __return_storage_ptr__->t = res.y;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

IntersecRes intersectionT(Segment const& segment, Triangle const& triangle)
{
  Vector const D = normalize(segment.b - segment.a);

  Vector e1 = triangle.y - triangle.x;
  Vector e2 = triangle.z - triangle.x;

  Vector P = crossProduct(D, e2);
  float det = dotProduct(e1, P);

  if (isCloseToZero(det))
    return {false, {}};

  float inv_det = 1.f / det;
  Vector T = segment.a - triangle.x;
  float u = dotProduct(T, P) * inv_det;
  if (u < 0.f || u > 1.f)
    return {false, {}};

  Vector Q = crossProduct(T, e1);
  float v = dotProduct(D, Q) * inv_det;

  if (v < 0.f || u + v > 1.f)
    return {false, {}};

  float t = dotProduct(e2, Q) * inv_det;
  if (t > 0)
  {
    Point res = segment.a + D * t;
    return {true, res, t};
  }

  return {false, {}};
}